

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

int __thiscall btQuantizedBvh::calcSplittingAxis(btQuantizedBvh *this,int startIndex,int endIndex)

{
  uint uVar1;
  int iVar2;
  int nodeIndex;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btVector3 bVar12;
  btVector3 bVar13;
  float local_78;
  float fStack_74;
  float local_68;
  float local_38;
  float fStack_34;
  
  iVar2 = endIndex - startIndex;
  if (iVar2 != 0 && startIndex <= endIndex) {
    fVar3 = 0.0;
    fVar4 = 0.0;
    fVar10 = 0.0;
    nodeIndex = startIndex;
    do {
      bVar12 = getAabbMax(this,nodeIndex);
      bVar13 = getAabbMin(this,nodeIndex);
      local_78 = bVar12.m_floats[0];
      fStack_74 = bVar12.m_floats[1];
      fVar10 = fVar10 + (local_78 + bVar13.m_floats[0]) * 0.5;
      local_68 = bVar12.m_floats[2];
      fVar3 = fVar3 + (bVar13.m_floats[1] + fStack_74) * 0.5;
      fVar4 = fVar4 + (bVar13.m_floats[2] + local_68) * 0.5;
      nodeIndex = nodeIndex + 1;
    } while (endIndex != nodeIndex);
    if (startIndex < endIndex) {
      fVar6 = 1.0 / (float)iVar2;
      fVar7 = 0.0;
      fVar9 = 0.0;
      fVar11 = 0.0;
      do {
        bVar12 = getAabbMax(this,startIndex);
        bVar13 = getAabbMin(this,startIndex);
        local_38 = bVar12.m_floats[0];
        fStack_34 = bVar12.m_floats[1];
        fVar8 = (local_38 + bVar13.m_floats[0]) * 0.5 - fVar10 * fVar6;
        fVar11 = fVar11 + fVar8 * fVar8;
        local_78 = bVar12.m_floats[2];
        fVar8 = (bVar13.m_floats[1] + fStack_34) * 0.5 - fVar6 * fVar3;
        fVar5 = (bVar13.m_floats[2] + local_78) * 0.5 - fVar6 * fVar4;
        fVar7 = fVar7 + fVar8 * fVar8;
        fVar9 = fVar9 + fVar5 * fVar5;
        startIndex = startIndex + 1;
      } while (endIndex != startIndex);
      goto LAB_0013906e;
    }
  }
  fVar7 = 0.0;
  fVar9 = 0.0;
  fVar11 = 0.0;
LAB_0013906e:
  fVar4 = 1.0 / ((float)iVar2 + -1.0);
  fVar11 = fVar11 * fVar4;
  fVar7 = fVar4 * fVar7;
  fVar3 = fVar7;
  if (fVar7 <= fVar11) {
    fVar3 = fVar11;
  }
  uVar1 = 2;
  if (fVar9 * fVar4 <= fVar3) {
    uVar1 = (uint)(fVar11 < fVar7);
  }
  return uVar1;
}

Assistant:

int	btQuantizedBvh::calcSplittingAxis(int startIndex,int endIndex)
{
	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);
		
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);
	
	return variance.maxAxis();
}